

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O3

void f8n::writeTo(ostream *out,string *level,string *tag,string *message)

{
  tm *__tp;
  size_t sVar1;
  ostream *poVar2;
  time_t rawtime;
  char buffer [64];
  long *local_a0;
  long local_98;
  long local_90 [2];
  time_t local_80;
  char local_78 [72];
  
  local_80 = 0;
  time(&local_80);
  __tp = localtime(&local_80);
  strftime(local_78,0x40,"%T",__tp);
  local_a0 = local_90;
  sVar1 = strlen(local_78);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,local_78,local_78 + sVar1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(out,(char *)local_a0,local_98);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," [",2);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(level->_M_dataplus)._M_p,level->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] [",3);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(tag->_M_dataplus)._M_p,tag->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] ",2);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(message->_M_dataplus)._M_p,message->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  std::ostream::flush();
  return;
}

Assistant:

static void writeTo(
        std::ostream& out,
        const std::string& level,
        const std::string& tag,
        const std::string& message)
    {
        out << timestamp() << " [" << level << "] [" << tag << "] " << message << "\n";
        out.flush();
    }